

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomNurbsCurves>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               GeomNurbsCurves *curves,string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  size_type sVar4;
  Property *pPVar5;
  mapped_type *this;
  ostream *poVar6;
  undefined4 in_stack_ffffffffffffe46c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ae0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ac0 [32];
  string local_1aa0 [32];
  ostringstream local_1a80 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18d8 [39];
  allocator local_18b1;
  string local_18b0 [32];
  string local_1890;
  ostringstream local_1870 [8];
  ostringstream ss_e_9;
  allocator local_16f1;
  undefined1 local_16f0 [32];
  undefined1 local_16d0 [40];
  ParseResult ret_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1668 [39];
  allocator local_1641;
  string local_1640 [32];
  string local_1620;
  ostringstream local_1600 [8];
  ostringstream ss_e_8;
  allocator local_1481;
  undefined1 local_1480 [32];
  undefined1 local_1460 [40];
  ParseResult ret_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13f8 [39];
  allocator local_13d1;
  string local_13d0 [32];
  string local_13b0;
  ostringstream local_1390 [8];
  ostringstream ss_e_7;
  allocator local_1211;
  undefined1 local_1210 [32];
  undefined1 local_11f0 [32];
  undefined1 local_11d0 [8];
  ParseResult ret_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1188 [39];
  allocator local_1161;
  string local_1160 [32];
  string local_1140;
  ostringstream local_1120 [8];
  ostringstream ss_e_6;
  allocator local_fa1;
  undefined1 local_fa0 [32];
  undefined1 local_f80 [32];
  undefined1 local_f60 [8];
  ParseResult ret_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f18 [39];
  allocator local_ef1;
  string local_ef0 [32];
  string local_ed0;
  ostringstream local_eb0 [8];
  ostringstream ss_e_5;
  allocator local_d31;
  undefined1 local_d30 [32];
  undefined1 local_d10 [32];
  undefined1 local_cf0 [8];
  ParseResult ret_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8 [39];
  allocator local_c81;
  string local_c80 [32];
  string local_c60;
  ostringstream local_c40 [8];
  ostringstream ss_e_4;
  allocator local_ac1;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [8];
  ParseResult ret_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38 [39];
  allocator local_a11;
  string local_a10 [32];
  string local_9f0;
  ostringstream local_9d0 [8];
  ostringstream ss_e_3;
  allocator local_851;
  undefined1 local_850 [32];
  undefined1 local_830 [32];
  undefined1 local_810 [8];
  ParseResult ret_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8 [39];
  allocator local_7a1;
  string local_7a0 [32];
  string local_780;
  ostringstream local_760 [8];
  ostringstream ss_e_2;
  allocator local_5e1;
  string local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558 [39];
  allocator local_531;
  string local_530 [32];
  string local_510;
  ostringstream local_4f0 [8];
  ostringstream ss_e_1;
  allocator local_371;
  undefined1 local_370 [32];
  undefined1 local_350 [32];
  undefined1 local_330 [8];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  string local_2a0;
  ostringstream local_280 [8];
  ostringstream ss_e;
  allocator local_101;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  undefined1 local_70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  GeomNurbsCurves *curves_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_70);
  bVar1 = (bool)(options->strict_allowedToken_check & 1);
  uVar2 = (uint)bVar1;
  bVar1 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_70,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&curves->super_GPrim,warn,
                     (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,bVar1);
  if (bVar1) {
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::begin(properties);
    prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::end(properties);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
      ret.err.field_2._8_8_ =
           ::std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
           ::operator*(&__end2);
      ::std::__cxx11::string::string((string *)local_e0,(string *)ret.err.field_2._8_8_);
      psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_100,"curveVertexCounts",&local_101);
      pPVar5 = (Property *)local_100;
      (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                ((ParseResult *)local_c0,(_anonymous_namespace_ *)local_70,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e0,psVar3,pPVar5,(string *)&curves->curveVertexCounts,
                 (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                 CONCAT44(in_stack_ffffffffffffe46c,uVar2));
      ::std::__cxx11::string::~string((string *)local_100);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_101);
      ::std::__cxx11::string::~string((string *)local_e0);
      if ((local_c0._0_4_ == Success) || (local_c0._0_4_ == AlreadyProcessed)) {
        __range2._4_4_ = 3;
      }
      else if (local_c0._0_4_ == Unmatched) {
        __range2._4_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_280);
        poVar6 = ::std::operator<<((ostream *)local_280,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xc60);
        ::std::operator<<(poVar6," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2c0,"Parsing attribute `{}` failed. Error: {}",&local_2c1);
        fmt::format<char[18],std::__cxx11::string>
                  (&local_2a0,(fmt *)local_2c0,(string *)"curveVertexCounts",(char (*) [18])&ret,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
        poVar6 = ::std::operator<<((ostream *)local_280,(string *)&local_2a0);
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::string::~string((string *)&local_2a0);
        ::std::__cxx11::string::~string(local_2c0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_2e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_1.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_2e8);
          ::std::__cxx11::string::~string((string *)local_2e8);
          ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        __range2._4_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_280);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_c0);
      if (__range2._4_4_ == 0) {
        ::std::__cxx11::string::string((string *)local_350,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_370,"points",&local_371);
        pPVar5 = (Property *)local_370;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                  ((ParseResult *)local_330,(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_350,psVar3,pPVar5,(string *)&curves->points,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffe46c,uVar2));
        ::std::__cxx11::string::~string((string *)local_370);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_371);
        ::std::__cxx11::string::~string((string *)local_350);
        if ((local_330._0_4_ == Success) || (local_330._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_330._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_4f0);
          poVar6 = ::std::operator<<((ostream *)local_4f0,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xc61);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_530,"Parsing attribute `{}` failed. Error: {}",&local_531);
          fmt::format<char[7],std::__cxx11::string>
                    (&local_510,(fmt *)local_530,(string *)"points",(char (*) [7])&ret_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
          poVar6 = ::std::operator<<((ostream *)local_4f0,(string *)&local_510);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_510);
          ::std::__cxx11::string::~string(local_530);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_531);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_558,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_2.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_558);
            ::std::__cxx11::string::~string((string *)local_558);
            ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_4f0);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_330);
        if (__range2._4_4_ != 0) goto joined_r0x002b23b8;
        ::std::__cxx11::string::string((string *)local_5c0,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_5e0,"velocities",&local_5e1);
        pPVar5 = (Property *)local_5e0;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  ((ParseResult *)local_5a0,(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_5c0,psVar3,pPVar5,(string *)&curves->velocities,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffe46c,uVar2));
        ::std::__cxx11::string::~string(local_5e0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
        ::std::__cxx11::string::~string((string *)local_5c0);
        if ((local_5a0._0_4_ == Success) || (local_5a0._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_5a0._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_760);
          poVar6 = ::std::operator<<((ostream *)local_760,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xc63);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_7a0,"Parsing attribute `{}` failed. Error: {}",&local_7a1);
          fmt::format<char[11],std::__cxx11::string>
                    (&local_780,(fmt *)local_7a0,(string *)"velocities",(char (*) [11])&ret_2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
          poVar6 = ::std::operator<<((ostream *)local_760,(string *)&local_780);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_780);
          ::std::__cxx11::string::~string(local_7a0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_7c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_3.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_7c8);
            ::std::__cxx11::string::~string((string *)local_7c8);
            ::std::__cxx11::string::~string((string *)(ret_3.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_760);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_5a0);
        if (__range2._4_4_ != 0) goto joined_r0x002b23b8;
        ::std::__cxx11::string::string((string *)local_830,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_850,"normals",&local_851);
        pPVar5 = (Property *)local_850;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                  ((ParseResult *)local_810,(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_830,psVar3,pPVar5,(string *)&curves->normals,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffe46c,uVar2));
        ::std::__cxx11::string::~string((string *)local_850);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_851);
        ::std::__cxx11::string::~string((string *)local_830);
        if ((local_810._0_4_ == Success) || (local_810._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_810._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_9d0);
          poVar6 = ::std::operator<<((ostream *)local_9d0,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xc65);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_a10,"Parsing attribute `{}` failed. Error: {}",&local_a11);
          fmt::format<char[8],std::__cxx11::string>
                    (&local_9f0,(fmt *)local_a10,(string *)"normals",(char (*) [8])&ret_3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
          poVar6 = ::std::operator<<((ostream *)local_9d0,(string *)&local_9f0);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_9f0);
          ::std::__cxx11::string::~string(local_a10);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_a11);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_a38,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_4.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_a38);
            ::std::__cxx11::string::~string((string *)local_a38);
            ::std::__cxx11::string::~string((string *)(ret_4.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_9d0);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_810);
        if (__range2._4_4_ != 0) goto joined_r0x002b23b8;
        ::std::__cxx11::string::string((string *)local_aa0,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_ac0,"accelerations",&local_ac1);
        pPVar5 = (Property *)local_ac0;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  ((ParseResult *)local_a80,(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_aa0,psVar3,pPVar5,(string *)&curves->accelerations,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffe46c,uVar2));
        ::std::__cxx11::string::~string((string *)local_ac0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
        ::std::__cxx11::string::~string((string *)local_aa0);
        if ((local_a80._0_4_ == Success) || (local_a80._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_a80._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_c40);
          poVar6 = ::std::operator<<((ostream *)local_c40,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xc67);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_c80,"Parsing attribute `{}` failed. Error: {}",&local_c81);
          fmt::format<char[14],std::__cxx11::string>
                    (&local_c60,(fmt *)local_c80,(string *)"accelerations",(char (*) [14])&ret_4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
          poVar6 = ::std::operator<<((ostream *)local_c40,(string *)&local_c60);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_c60);
          ::std::__cxx11::string::~string(local_c80);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_c81);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_ca8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_5.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_ca8);
            ::std::__cxx11::string::~string((string *)local_ca8);
            ::std::__cxx11::string::~string((string *)(ret_5.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_c40);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_a80);
        if (__range2._4_4_ != 0) goto joined_r0x002b23b8;
        ::std::__cxx11::string::string((string *)local_d10,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_d30,"widths",&local_d31);
        pPVar5 = (Property *)local_d30;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                  ((ParseResult *)local_cf0,(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d10,psVar3,pPVar5,(string *)&curves->widths,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffe46c,uVar2));
        ::std::__cxx11::string::~string((string *)local_d30);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_d31);
        ::std::__cxx11::string::~string((string *)local_d10);
        if ((local_cf0._0_4_ == Success) || (local_cf0._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_cf0._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_eb0);
          poVar6 = ::std::operator<<((ostream *)local_eb0,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xc68);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_ef0,"Parsing attribute `{}` failed. Error: {}",&local_ef1);
          fmt::format<char[7],std::__cxx11::string>
                    (&local_ed0,(fmt *)local_ef0,(string *)"widths",(char (*) [7])&ret_5,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
          poVar6 = ::std::operator<<((ostream *)local_eb0,(string *)&local_ed0);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_ed0);
          ::std::__cxx11::string::~string(local_ef0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_ef1);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_f18,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_6.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_f18);
            ::std::__cxx11::string::~string((string *)local_f18);
            ::std::__cxx11::string::~string((string *)(ret_6.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_eb0);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_cf0);
        if (__range2._4_4_ != 0) goto joined_r0x002b23b8;
        ::std::__cxx11::string::string((string *)local_f80,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_fa0,"order",&local_fa1);
        pPVar5 = (Property *)local_fa0;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                  ((ParseResult *)local_f60,(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_f80,psVar3,pPVar5,(string *)&curves->order,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *
                   )CONCAT44(in_stack_ffffffffffffe46c,uVar2));
        ::std::__cxx11::string::~string((string *)local_fa0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_fa1);
        ::std::__cxx11::string::~string((string *)local_f80);
        if ((local_f60._0_4_ == Success) || (local_f60._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_f60._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1120);
          poVar6 = ::std::operator<<((ostream *)local_1120,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xc6b);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1160,"Parsing attribute `{}` failed. Error: {}",&local_1161);
          fmt::format<char[6],std::__cxx11::string>
                    (&local_1140,(fmt *)local_1160,(string *)"order",(char (*) [6])&ret_6,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
          poVar6 = ::std::operator<<((ostream *)local_1120,(string *)&local_1140);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_1140);
          ::std::__cxx11::string::~string(local_1160);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1161);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_1188,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_7.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_1188);
            ::std::__cxx11::string::~string((string *)local_1188);
            ::std::__cxx11::string::~string((string *)(ret_7.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1120);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_f60);
        if (__range2._4_4_ != 0) goto joined_r0x002b23b8;
        ::std::__cxx11::string::string((string *)local_11f0,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_1210,"knots",&local_1211);
        pPVar5 = (Property *)local_1210;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<double,std::allocator<double>>>
                  ((ParseResult *)local_11d0,(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_11f0,psVar3,pPVar5,(string *)&curves->knots,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffe46c,uVar2));
        ::std::__cxx11::string::~string((string *)local_1210);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1211);
        ::std::__cxx11::string::~string((string *)local_11f0);
        if ((local_11d0._0_4_ == Success) || (local_11d0._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_11d0._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1390);
          poVar6 = ::std::operator<<((ostream *)local_1390,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xc6c);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_13d0,"Parsing attribute `{}` failed. Error: {}",&local_13d1);
          fmt::format<char[6],std::__cxx11::string>
                    (&local_13b0,(fmt *)local_13d0,(string *)"knots",(char (*) [6])&ret_7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
          poVar6 = ::std::operator<<((ostream *)local_1390,(string *)&local_13b0);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_13b0);
          ::std::__cxx11::string::~string(local_13d0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_13d1);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_13f8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_8.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_13f8);
            ::std::__cxx11::string::~string((string *)local_13f8);
            ::std::__cxx11::string::~string((string *)(ret_8.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1390);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_11d0);
        if (__range2._4_4_ != 0) goto joined_r0x002b23b8;
        ::std::__cxx11::string::string((string *)local_1460,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_1480,"ranges",&local_1481);
        pPVar5 = (Property *)local_1480;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                  ((ParseResult *)(local_1460 + 0x20),(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1460,psVar3,pPVar5,(string *)&curves->ranges,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffe46c,uVar2));
        ::std::__cxx11::string::~string((string *)local_1480);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1481);
        ::std::__cxx11::string::~string((string *)local_1460);
        if ((local_1460._32_4_ == 0) || (local_1460._32_4_ == 2)) {
          __range2._4_4_ = 3;
        }
        else if (local_1460._32_4_ == 1) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1600);
          poVar6 = ::std::operator<<((ostream *)local_1600,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xc6d);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1640,"Parsing attribute `{}` failed. Error: {}",&local_1641);
          fmt::format<char[7],std::__cxx11::string>
                    (&local_1620,(fmt *)local_1640,(string *)"ranges",(char (*) [7])&ret_8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
          poVar6 = ::std::operator<<((ostream *)local_1600,(string *)&local_1620);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_1620);
          ::std::__cxx11::string::~string(local_1640);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1641);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_1668,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_9.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_1668);
            ::std::__cxx11::string::~string((string *)local_1668);
            ::std::__cxx11::string::~string((string *)(ret_9.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1600);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_1460 + 0x20));
        if (__range2._4_4_ != 0) goto joined_r0x002b23b8;
        ::std::__cxx11::string::string((string *)local_16d0,(string *)ret.err.field_2._8_8_);
        psVar3 = (string *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_16f0,"pointWeights",&local_16f1);
        pPVar5 = (Property *)local_16f0;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<double,std::allocator<double>>>
                  ((ParseResult *)(local_16d0 + 0x20),(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_16d0,psVar3,pPVar5,(string *)&curves->pointWeights,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffe46c,uVar2));
        ::std::__cxx11::string::~string((string *)local_16f0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_16f1);
        ::std::__cxx11::string::~string((string *)local_16d0);
        if ((local_16d0._32_4_ == 0) || (local_16d0._32_4_ == 2)) {
          __range2._4_4_ = 3;
        }
        else if (local_16d0._32_4_ == 1) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1870);
          poVar6 = ::std::operator<<((ostream *)local_1870,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xc6e);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_18b0,"Parsing attribute `{}` failed. Error: {}",&local_18b1);
          fmt::format<char[13],std::__cxx11::string>
                    (&local_1890,(fmt *)local_18b0,(string *)"pointWeights",(char (*) [13])&ret_9,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
          poVar6 = ::std::operator<<((ostream *)local_1870,(string *)&local_1890);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_1890);
          ::std::__cxx11::string::~string(local_18b0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_18b1);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_18d8,local_18f8);
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_18d8);
            ::std::__cxx11::string::~string((string *)local_18d8);
            ::std::__cxx11::string::~string((string *)local_18f8);
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1870);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_16d0 + 0x20));
        if (__range2._4_4_ != 0) goto joined_r0x002b23b8;
        sVar4 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_70,(key_type *)ret.err.field_2._8_8_);
        if (sVar4 == 0) {
          pPVar5 = (Property *)(ret.err.field_2._8_8_ + 0x20);
          this = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 ::operator[](&(curves->super_GPrim).props,(key_type *)ret.err.field_2._8_8_);
          Property::operator=(this,pPVar5);
          ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,(value_type *)ret.err.field_2._8_8_);
        }
        sVar4 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_70,(key_type *)ret.err.field_2._8_8_);
        if (sVar4 == 0) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a80);
          poVar6 = ::std::operator<<((ostream *)local_1a80,"[warn]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xc72);
          ::std::operator<<(poVar6," ");
          ::std::operator+((char *)local_1aa0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Unsupported/unimplemented property: ");
          poVar6 = ::std::operator<<((ostream *)local_1a80,local_1aa0);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string(local_1aa0);
          if (warn != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_1ac0,local_1ae0);
            ::std::__cxx11::string::operator=((string *)warn,(string *)local_1ac0);
            ::std::__cxx11::string::~string((string *)local_1ac0);
            ::std::__cxx11::string::~string((string *)local_1ae0);
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_1a80);
        }
      }
      else {
joined_r0x002b23b8:
        if (__range2._4_4_ != 3) goto LAB_002b258d;
      }
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
      ::operator++(&__end2);
    }
    spec_local._7_1_ = 1;
  }
  else {
    spec_local._7_1_ = 0;
  }
LAB_002b258d:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomNurbsCurves *curves,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, curves, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "curveVertexCounts", GeomNurbsCurves,
                         curves->curveVertexCounts)
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomNurbsCurves, curves->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", GeomNurbsCurves,
                          curves->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomNurbsCurves,
                  curves->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", GeomNurbsCurves,
                 curves->accelerations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "widths", GeomNurbsCurves, curves->widths)

    //
    PARSE_TYPED_ATTRIBUTE(table, prop, "order", GeomNurbsCurves, curves->order)
    PARSE_TYPED_ATTRIBUTE(table, prop, "knots", GeomNurbsCurves, curves->knots)
    PARSE_TYPED_ATTRIBUTE(table, prop, "ranges", GeomNurbsCurves, curves->ranges)
    PARSE_TYPED_ATTRIBUTE(table, prop, "pointWeights", GeomNurbsCurves, curves->pointWeights)

    ADD_PROPERTY(table, prop, GeomBasisCurves, curves->props)

    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}